

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O3

void __thiscall
duckdb::MultiFileFunction<duckdb::CSVMultiFileInfo>::MultiFileFunction
          (MultiFileFunction<duckdb::CSVMultiFileInfo> *this,string *name_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_69;
  string local_68;
  LogicalType local_48;
  vector<duckdb::LogicalType,_true> local_30;
  
  local_68._M_dataplus._M_p = (name_p->_M_dataplus)._M_p;
  paVar1 = &name_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar1) {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_68.field_2._8_8_ = *(undefined8 *)((long)&name_p->field_2 + 8);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_68._M_string_length = name_p->_M_string_length;
  (name_p->_M_dataplus)._M_p = (pointer)paVar1;
  name_p->_M_string_length = 0;
  (name_p->field_2)._M_local_buf[0] = '\0';
  LogicalType::LogicalType(&local_48,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_48;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_30,__l,
             &local_69);
  TableFunction::TableFunction
            (&this->super_TableFunction,&local_68,&local_30,MultiFileScan,MultiFileBind,
             MultiFileInitGlobal,MultiFileInitLocal);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_30);
  LogicalType::~LogicalType(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  (this->super_TableFunction).super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function
  ._vptr_Function = (_func_int **)&PTR__TableFunction_019896f8;
  (this->super_TableFunction).cardinality = MultiFileCardinality;
  (this->super_TableFunction).table_scan_progress = MultiFileProgress;
  (this->super_TableFunction).get_partition_data = MultiFileGetPartitionData;
  (this->super_TableFunction).get_bind_info = MultiFileGetBindInfo;
  (this->super_TableFunction).projection_pushdown = true;
  (this->super_TableFunction).pushdown_complex_filter = MultiFileComplexFilterPushdown;
  (this->super_TableFunction).get_partition_info = MultiFileGetPartitionInfo;
  (this->super_TableFunction).get_virtual_columns = MultiFileGetVirtualColumns;
  (this->super_TableFunction).dynamic_to_string = MultiFileDynamicToString_abi_cxx11_;
  MultiFileReader::AddParameters(&this->super_TableFunction);
  return;
}

Assistant:

explicit MultiFileFunction(string name_p)
	    : TableFunction(std::move(name_p), {LogicalType::VARCHAR}, MultiFileScan, MultiFileBind, MultiFileInitGlobal,
	                    MultiFileInitLocal) {
		cardinality = MultiFileCardinality;
		table_scan_progress = MultiFileProgress;
		get_partition_data = MultiFileGetPartitionData;
		get_bind_info = MultiFileGetBindInfo;
		projection_pushdown = true;
		pushdown_complex_filter = MultiFileComplexFilterPushdown;
		get_partition_info = MultiFileGetPartitionInfo;
		get_virtual_columns = MultiFileGetVirtualColumns;
		dynamic_to_string = MultiFileDynamicToString;
		MultiFileReader::AddParameters(*this);
	}